

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_client_close(archive_write_filter *f)

{
  archive *a_00;
  long *__ptr;
  char *pcVar1;
  int local_4c;
  char *pcStack_48;
  int ret;
  char *p;
  size_t to_write;
  ssize_t bytes_written;
  ssize_t target_block_length;
  ssize_t block_length;
  archive_none *state;
  archive_write *a;
  archive_write_filter *f_local;
  
  a_00 = f->archive;
  __ptr = (long *)f->data;
  local_4c = 0;
  if (__ptr[3] != __ptr[2]) {
    target_block_length = *__ptr - __ptr[1];
    if ((int)a_00[1].current_oemcp < 1) {
      bytes_written = (ssize_t)(int)a_00[1].current_codepage;
    }
    else {
      bytes_written =
           (long)(int)a_00[1].current_oemcp *
           ((target_block_length + (int)a_00[1].current_oemcp + -1) /
           (long)(int)a_00[1].current_oemcp);
    }
    if ((int)a_00[1].current_codepage < bytes_written) {
      bytes_written = (ssize_t)(int)a_00[1].current_codepage;
    }
    if (target_block_length < bytes_written) {
      memset((void *)__ptr[3],0,bytes_written - target_block_length);
      target_block_length = bytes_written;
    }
    pcStack_48 = (char *)__ptr[2];
    for (p = (char *)target_block_length; p != (char *)0x0; p = p + -(long)pcVar1) {
      pcVar1 = (char *)(*(code *)a_00[1].error_string.s)(a_00,a_00[1].current_code,pcStack_48,p);
      if ((long)pcVar1 < 1) {
        local_4c = -0x1e;
        break;
      }
      if (p < pcVar1) {
        archive_set_error(a_00,-1,"write overrun");
        local_4c = -0x1e;
        break;
      }
      pcStack_48 = pcVar1 + (long)pcStack_48;
    }
  }
  if (a_00[1].error_string.length != 0) {
    (*(code *)a_00[1].error_string.length)(a_00,a_00[1].current_code);
  }
  free((void *)__ptr[2]);
  free(__ptr);
  f->state = 4;
  return local_4c;
}

Assistant:

static int
archive_write_client_close(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state = (struct archive_none *)f->data;
	ssize_t block_length;
	ssize_t target_block_length;
	ssize_t bytes_written;
	size_t to_write;
	char *p;
	int ret = ARCHIVE_OK;

	/* If there's pending data, pad and write the last block */
	if (state->next != state->buffer) {
		block_length = state->buffer_size - state->avail;

		/* Tricky calculation to determine size of last block */
		if (a->bytes_in_last_block <= 0)
			/* Default or Zero: pad to full block */
			target_block_length = a->bytes_per_block;
		else
			/* Round to next multiple of bytes_in_last_block. */
			target_block_length = a->bytes_in_last_block *
			    ( (block_length + a->bytes_in_last_block - 1) /
			        a->bytes_in_last_block);
		if (target_block_length > a->bytes_per_block)
			target_block_length = a->bytes_per_block;
		if (block_length < target_block_length) {
			memset(state->next, 0,
			    target_block_length - block_length);
			block_length = target_block_length;
		}
		p = state->buffer;
		to_write = block_length;
		while (to_write > 0) {
			bytes_written = (a->client_writer)(&a->archive,
			    a->client_data, p, to_write);
			if (bytes_written <= 0) {
				ret = ARCHIVE_FATAL;
				break;
			}
			if ((size_t)bytes_written > to_write) {
				archive_set_error(&(a->archive),
						  -1, "write overrun");
				ret = ARCHIVE_FATAL;
				break;
			}
			p += bytes_written;
			to_write -= bytes_written;
		}
	}
	if (a->client_closer)
		(*a->client_closer)(&a->archive, a->client_data);
	free(state->buffer);
	free(state);

	/* Clear the close handler myself not to be called again. */
	f->state = ARCHIVE_WRITE_FILTER_STATE_CLOSED;
	return (ret);
}